

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::returnFromHighs(Highs *this,HighsStatus highs_return_status)

{
  HighsModel *lp;
  HEkk *this_00;
  HighsLogOptions *log_options;
  double *pdVar1;
  bool bVar2;
  HighsDebugStatus HVar3;
  string local_50;
  
  forceHighsSolutionBasisSize(this);
  lp = &this->model_;
  HVar3 = debugHighsBasisConsistent(&this->options_,&lp->lp_,&this->basis_);
  if (HVar3 == kLogicalError) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "returnFromHighs: Supposed to be a HiGHS basis, but not consistent\n");
    highs_return_status = kError;
  }
  this_00 = &this->ekk_instance_;
  HVar3 = HEkk::debugRetainedDataOk(this_00,&lp->lp_);
  if (HVar3 == kLogicalError) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "returnFromHighs: Retained Ekk data not OK\n");
    highs_return_status = kError;
  }
  if (this->called_return_from_run == false) {
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                "Highs::returnFromHighs() called with called_return_from_run false\n");
  }
  pdVar1 = (this->timer_).clock_start.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
    HighsTimer::stop(&this->timer_,0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"returnFromHighs","");
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar2 = lpDimensionsOk(&local_50,&lp->lp_,log_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (!bVar2) {
    highsLogDev(log_options,kError,"LP Dimension error in returnFromHighs()\n");
    highs_return_status = kError;
  }
  if ((this->ekk_instance_).status_.has_nla == true) {
    bVar2 = HEkk::lpFactorRowCompatible(this_00,(this->model_).lp_.num_row_);
    if (!bVar2) {
      highsLogDev(log_options,kWarning,
                  "Highs::returnFromHighs(): LP and HFactor have inconsistent numbers of rows\n");
      HEkk::clear(this_00);
    }
  }
  return highs_return_status;
}

Assistant:

HighsStatus Highs::returnFromHighs(HighsStatus highs_return_status) {
  // Applies checks before returning from HiGHS
  HighsStatus return_status = highs_return_status;

  forceHighsSolutionBasisSize();

  const bool consistent =
      debugHighsBasisConsistent(options_, model_.lp_, basis_) !=
      HighsDebugStatus::kLogicalError;
  if (!consistent) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "returnFromHighs: Supposed to be a HiGHS basis, but not consistent\n");
    assert(consistent);
    return_status = HighsStatus::kError;
  }
  // Check that any retained Ekk data - basis and NLA - are OK
  bool retained_ekk_data_ok = ekk_instance_.debugRetainedDataOk(model_.lp_) !=
                              HighsDebugStatus::kLogicalError;
  if (!retained_ekk_data_ok) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "returnFromHighs: Retained Ekk data not OK\n");
    assert(retained_ekk_data_ok);
    return_status = HighsStatus::kError;
  }
  // Check that returnFromRun() has been called
  if (!called_return_from_run) {
    highsLogDev(
        options_.log_options, HighsLogType::kError,
        "Highs::returnFromHighs() called with called_return_from_run false\n");
    assert(called_return_from_run);
  }
  // Stop the HiGHS run clock if it is running
  if (timer_.running()) timer_.stop();
  const bool dimensions_ok =
      lpDimensionsOk("returnFromHighs", model_.lp_, options_.log_options);
  if (!dimensions_ok) {
    highsLogDev(options_.log_options, HighsLogType::kError,
                "LP Dimension error in returnFromHighs()\n");
    return_status = HighsStatus::kError;
  }
  assert(dimensions_ok);
  if (ekk_instance_.status_.has_nla) {
    const bool lp_factor_row_compatible =
        ekk_instance_.lpFactorRowCompatible(model_.lp_.num_row_);
    if (!lp_factor_row_compatible) {
      highsLogDev(options_.log_options, HighsLogType::kWarning,
                  "Highs::returnFromHighs(): LP and HFactor have inconsistent "
                  "numbers of rows\n");
      assert(lp_factor_row_compatible);
      // Clear Ekk entirely
      ekk_instance_.clear();
    }
  }
  return return_status;
}